

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O3

ssh_keyalg * find_pubkey_alg_len(ptrlen name)

{
  ssh_keyalg *psVar1;
  _Bool _Var2;
  long lVar3;
  
  lVar3 = 0;
  do {
    psVar1 = *(ssh_keyalg **)((long)all_keyalgs + lVar3);
    _Var2 = ptrlen_eq_string(name,psVar1->ssh_id);
    if (_Var2) {
      return psVar1;
    }
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x88);
  return (ssh_keyalg *)0x0;
}

Assistant:

const ssh_keyalg *find_pubkey_alg_len(ptrlen name)
{
    for (size_t i = 0; i < n_keyalgs; i++)
        if (ptrlen_eq_string(name, all_keyalgs[i]->ssh_id))
            return all_keyalgs[i];

    return NULL;
}